

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTransaction::SetFromHex(ConfidentialTransaction *this,string *hex_string)

{
  uchar *__first;
  uint32_t index;
  uint32_t sequence;
  void *pvVar1;
  uchar *puVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pCVar6;
  long lVar7;
  long *plVar8;
  CfdException *this_00;
  pointer pCVar9;
  pointer pCVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  wally_tx *tx_pointer;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_buf;
  ConfidentialValue local_3e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blinding_buf;
  ScriptWitness local_3a0;
  ConfidentialNonce local_380;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txid_buf;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> vout_work;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> vin_work;
  ScriptWitness local_2e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_buf;
  ByteData local_2b0;
  ByteData256 local_298;
  ByteData256 local_280;
  Script unlocking_script;
  ByteData local_230;
  ByteData local_218;
  ByteData local_200;
  ByteData256 local_1e8;
  undefined **local_1d0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1c8;
  ScriptWitness local_1b0;
  ConfidentialTxIn txin;
  
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  vin_work.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vin_work.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vin_work.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vout_work.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vout_work.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vout_work.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ret = wally_tx_from_hex((hex_string->_M_dataplus)._M_p,2);
  if (ret != 0) {
    txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x21f267;
    txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x516;
    txin.super_AbstractTxIn.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "SetFromHex";
    logger::log<int&>((CfdSourceLocation *)&txin,kCfdLogLevelWarning,"wally_tx_from_hex NG[{}] ",
                      &ret);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)&txin.super_AbstractTxIn.txid_.data_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&txin,"transaction data invalid.","");
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&txin);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  (this->super_AbstractTransaction).wally_tx_pointer_ = (void *)0x0;
  ret = 0;
  if (uRam0000000000000010 != 0) {
    uVar12 = 0;
    do {
      __first = (uchar *)(lRam0000000000000008 + uVar12 * 0xd0);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&txid_buf,__first,
                 (uchar *)(lRam0000000000000008 + uVar12 * 0xd0 + 0x20),(allocator_type *)&txin);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&script_buf,
                 *(uchar **)(__first + 0x28),*(uchar **)(__first + 0x28) + *(long *)(__first + 0x30)
                 ,(allocator_type *)&txin);
      ByteData::ByteData((ByteData *)&txin,&script_buf);
      Script::Script(&unlocking_script,(ByteData *)&txin);
      if (txin.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
        operator_delete(txin.super_AbstractTxIn._vptr_AbstractTxIn);
      }
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&blinding_buf,__first + 0x41
                 ,__first + 0x61,(allocator_type *)&txin);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&entropy,__first + 0x61,
                 __first + 0x81,(allocator_type *)&txin);
      ByteData256::ByteData256(&local_1e8,&txid_buf);
      Txid::Txid((Txid *)&local_380,&local_1e8);
      index = *(uint32_t *)(__first + 0x20);
      sequence = *(uint32_t *)(__first + 0x24);
      local_3a0._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00259cd8;
      local_3a0.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3a0.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3a0.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ByteData256::ByteData256(&local_280,&blinding_buf);
      ByteData256::ByteData256(&local_298,&entropy);
      ConvertToByteData(&local_200,*(uint8_t **)(__first + 0x88),*(size_t *)(__first + 0x90));
      ConfidentialValue::ConfidentialValue((ConfidentialValue *)&witness_buf,&local_200);
      ConvertToByteData(&local_218,*(uint8_t **)(__first + 0x98),*(size_t *)(__first + 0xa0));
      ConfidentialValue::ConfidentialValue(&local_3e0,&local_218);
      ConvertToByteData(&local_2b0,*(uint8_t **)(__first + 0xa8),*(size_t *)(__first + 0xb0));
      ConvertToByteData(&local_230,*(uint8_t **)(__first + 0xb8),*(size_t *)(__first + 0xc0));
      local_2e8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00259cd8;
      local_2e8.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2e8.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2e8.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ConfidentialTxIn::ConfidentialTxIn
                (&txin,(Txid *)&local_380,index,sequence,&unlocking_script,&local_3a0,&local_280,
                 &local_298,(ConfidentialValue *)&witness_buf,&local_3e0,&local_2b0,&local_230,
                 &local_2e8);
      local_2e8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00259cd8;
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&local_2e8.witness_stack_);
      if (local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_230.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_2b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_3e0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0025a020;
      if (local_3e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_218.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__ConfidentialValue_0025a020;
      if (witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        operator_delete(witness_buf.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
      if (local_200.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_298.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_280.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_3a0._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00259cd8;
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&local_3a0.witness_stack_);
      local_380._vptr_ConfidentialNonce = (_func_int **)&PTR__Txid_00259ad8;
      if (local_380.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_380.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      plVar8 = *(long **)(__first + 0x38);
      if ((plVar8 != (long *)0x0) && (plVar8[1] != 0)) {
        lVar13 = 8;
        uVar11 = 0;
        do {
          puVar2 = *(uchar **)(*plVar8 + -8 + lVar13);
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&witness_buf,puVar2,
                     puVar2 + *(long *)(*plVar8 + lVar13),(allocator_type *)&local_3e0);
          ByteData::ByteData((ByteData *)&local_3e0,&witness_buf);
          AbstractTxIn::AddScriptWitnessStack
                    (&local_1b0,&txin.super_AbstractTxIn,(ByteData *)&local_3e0);
          local_1b0._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00259cd8;
          ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                    (&local_1b0.witness_stack_);
          if (local_3e0._vptr_ConfidentialValue != (_func_int **)0x0) {
            operator_delete(local_3e0._vptr_ConfidentialValue);
          }
          if (witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(witness_buf.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          uVar11 = uVar11 + 1;
          plVar8 = *(long **)(__first + 0x38);
          lVar13 = lVar13 + 0x10;
        } while (uVar11 < (ulong)plVar8[1]);
      }
      plVar8 = *(long **)(__first + 200);
      if ((plVar8 != (long *)0x0) && (plVar8[1] != 0)) {
        lVar13 = 8;
        uVar11 = 0;
        do {
          puVar2 = *(uchar **)(*plVar8 + -8 + lVar13);
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&witness_buf,puVar2,
                     puVar2 + *(long *)(*plVar8 + lVar13),(allocator_type *)&local_3e0);
          ByteData::ByteData((ByteData *)&local_3e0,&witness_buf);
          ScriptWitness::AddWitnessStack(&txin.pegin_witness_,(ByteData *)&local_3e0);
          local_1d0 = &PTR__ScriptWitness_00259cd8;
          ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                    (&local_1c8,&txin.pegin_witness_.witness_stack_);
          local_1d0 = &PTR__ScriptWitness_00259cd8;
          ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                    (&local_1c8);
          if (local_3e0._vptr_ConfidentialValue != (_func_int **)0x0) {
            operator_delete(local_3e0._vptr_ConfidentialValue);
          }
          if (witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(witness_buf.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          uVar11 = uVar11 + 1;
          plVar8 = *(long **)(__first + 200);
          lVar13 = lVar13 + 0x10;
        } while (uVar11 < (ulong)plVar8[1]);
      }
      ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
      push_back(&vin_work,&txin);
      ConfidentialTxIn::~ConfidentialTxIn(&txin);
      if (entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (blinding_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(blinding_buf.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Script::~Script(&unlocking_script);
      if (script_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(script_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uRam0000000000000010);
  }
  txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x21f267;
  txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x55b;
  txin.super_AbstractTxIn.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "SetFromHex";
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)&txin,kCfdLogLevelInfo,"num_outputs={} ",&uRam0000000000000028);
  if (uRam0000000000000028 != 0) {
    lVar13 = 0x68;
    uVar12 = 0;
    do {
      lVar7 = lRam0000000000000020;
      ConvertToByteData((ByteData *)&local_3a0,*(uint8_t **)(lRam0000000000000020 + -0x60 + lVar13),
                        *(size_t *)(lRam0000000000000020 + -0x58 + lVar13));
      Script::Script(&unlocking_script,(ByteData *)&local_3a0);
      ConvertToByteData((ByteData *)&local_2e8,*(uint8_t **)(lVar7 + -0x48 + lVar13),
                        *(size_t *)(lVar7 + -0x40 + lVar13));
      ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&witness_buf,(ByteData *)&local_2e8);
      ConvertToByteData((ByteData *)&txid_buf,*(uint8_t **)(lVar7 + -0x38 + lVar13),
                        *(size_t *)(lVar7 + -0x30 + lVar13));
      ConfidentialValue::ConfidentialValue(&local_3e0,(ByteData *)&txid_buf);
      ConvertToByteData((ByteData *)&script_buf,*(uint8_t **)(lVar7 + -0x28 + lVar13),
                        *(size_t *)(lVar7 + -0x20 + lVar13));
      ConfidentialNonce::ConfidentialNonce(&local_380,(ByteData *)&script_buf);
      ConvertToByteData((ByteData *)&blinding_buf,*(uint8_t **)(lVar7 + -0x18 + lVar13),
                        *(size_t *)(lVar7 + -0x10 + lVar13));
      ConvertToByteData((ByteData *)&entropy,*(uint8_t **)(lVar7 + -8 + lVar13),
                        *(size_t *)(lVar7 + lVar13));
      ConfidentialTxOut::ConfidentialTxOut
                ((ConfidentialTxOut *)&txin,&unlocking_script,(ConfidentialAssetId *)&witness_buf,
                 &local_3e0,&local_380,(ByteData *)&blinding_buf,(ByteData *)&entropy);
      if (entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (blinding_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(blinding_buf.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_380._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00259fe0;
      if (local_380.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_380.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (script_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(script_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_3e0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0025a020;
      if (local_3e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__ConfidentialAssetId_0025a000;
      if (witness_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        operator_delete(witness_buf.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
      if (local_2e8._vptr_ScriptWitness != (_func_int **)0x0) {
        operator_delete(local_2e8._vptr_ScriptWitness);
      }
      Script::~Script(&unlocking_script);
      if (local_3a0._vptr_ScriptWitness != (_func_int **)0x0) {
        operator_delete(local_3a0._vptr_ScriptWitness);
      }
      ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
      push_back(&vout_work,(value_type *)&txin);
      ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&txin);
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x70;
    } while (uVar12 < uRam0000000000000028);
  }
  if (pvVar1 != (void *)0x0) {
    wally_tx_free(pvVar1);
    pCVar3 = (this->vin_).
             super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (this->vin_).
             super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pCVar9 = pCVar3;
    if (pCVar4 != pCVar3) {
      do {
        (**(pCVar9->super_AbstractTxIn)._vptr_AbstractTxIn)(pCVar9);
        pCVar9 = pCVar9 + 1;
      } while (pCVar9 != pCVar4);
      (this->vin_).
      super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar3;
    }
    pCVar5 = (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar6 = (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pCVar10 = pCVar5;
    if (pCVar6 != pCVar5) {
      do {
        (**(pCVar10->super_AbstractTxOut)._vptr_AbstractTxOut)(pCVar10);
        pCVar10 = pCVar10 + 1;
      } while (pCVar10 != pCVar6);
      (this->vout_).
      super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
      ._M_impl.super__Vector_impl_data._M_finish = pCVar5;
    }
  }
  ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
  operator=(&this->vin_,&vin_work);
  ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
  operator=(&this->vout_,&vout_work);
  ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
  ~vector(&vout_work);
  ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::~vector
            (&vin_work);
  return;
}

Assistant:

void ConfidentialTransaction::SetFromHex(const std::string &hex_string) {
  void *original_address = wally_tx_pointer_;
  std::vector<ConfidentialTxIn> vin_work;
  std::vector<ConfidentialTxOut> vout_work;

  // It is assumed that tx information has been created.
  // (If it is not created, it will cause inconsistency)
  struct wally_tx *tx_pointer = NULL;
  uint32_t flag = WALLY_TX_FLAG_USE_ELEMENTS;
  int ret = wally_tx_from_hex(hex_string.c_str(), flag, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }
  wally_tx_pointer_ = tx_pointer;

  try {
    // create ConfidentialTxIn and ConfidentialTxOut
    for (size_t index = 0; index < tx_pointer->num_inputs; ++index) {
      struct wally_tx_input *txin_item = &tx_pointer->inputs[index];
      std::vector<uint8_t> txid_buf(
          txin_item->txhash, txin_item->txhash + sizeof(txin_item->txhash));
      std::vector<uint8_t> script_buf(
          txin_item->script, txin_item->script + txin_item->script_len);
      Script unlocking_script = Script(ByteData(script_buf));
      /* Temporarily comment out
      if (!unlocking_script.IsPushOnly()) {
        warn(CFD_LOG_SOURCE, "IsPushOnly() false.");
        throw CfdException(
            kCfdIllegalArgumentError,
            "unlocking script error. "
            "The script needs to be push operator only.");
      } */
      std::vector<uint8_t> blinding_buf(
          txin_item->blinding_nonce,
          txin_item->blinding_nonce + sizeof(txin_item->blinding_nonce));
      std::vector<uint8_t> entropy(
          txin_item->entropy, txin_item->entropy + sizeof(txin_item->entropy));
      ConfidentialTxIn txin(
          Txid(ByteData256(txid_buf)), txin_item->index, txin_item->sequence,
          unlocking_script, ScriptWitness(), ByteData256(blinding_buf),
          ByteData256(entropy),
          ConfidentialValue(ConvertToByteData(
              txin_item->issuance_amount, txin_item->issuance_amount_len)),
          ConfidentialValue(ConvertToByteData(
              txin_item->inflation_keys, txin_item->inflation_keys_len)),
          ConvertToByteData(
              txin_item->issuance_amount_rangeproof,
              txin_item->issuance_amount_rangeproof_len),
          ConvertToByteData(
              txin_item->inflation_keys_rangeproof,
              txin_item->inflation_keys_rangeproof_len),
          ScriptWitness());
      if ((txin_item->witness != NULL) &&
          (txin_item->witness->num_items != 0)) {
        struct wally_tx_witness_item *witness_stack;
        for (size_t w_index = 0; w_index < txin_item->witness->num_items;
             ++w_index) {
          witness_stack = &txin_item->witness->items[w_index];
          const std::vector<uint8_t> witness_buf(
              witness_stack->witness,
              witness_stack->witness + witness_stack->witness_len);
          txin.AddScriptWitnessStack(ByteData(witness_buf));
        }
      }
      if ((txin_item->pegin_witness != NULL) &&
          (txin_item->pegin_witness->num_items != 0)) {
        for (size_t w_index = 0; w_index < txin_item->pegin_witness->num_items;
             ++w_index) {
          struct wally_tx_witness_item *witness_stack;
          witness_stack = &txin_item->pegin_witness->items[w_index];
          const std::vector<uint8_t> witness_buf(
              witness_stack->witness,
              witness_stack->witness + witness_stack->witness_len);
          txin.AddPeginWitnessStack(ByteData(witness_buf));
        }
      }
      vin_work.push_back(txin);
    }

    info(CFD_LOG_SOURCE, "num_outputs={} ", tx_pointer->num_outputs);
    for (size_t index = 0; index < tx_pointer->num_outputs; ++index) {
      struct wally_tx_output *txout_item = &tx_pointer->outputs[index];
      ConfidentialTxOut txout(
          Script(
              ConvertToByteData(txout_item->script, txout_item->script_len)),
          ConfidentialAssetId(
              ConvertToByteData(txout_item->asset, txout_item->asset_len)),
          ConfidentialValue(
              ConvertToByteData(txout_item->value, txout_item->value_len)),
          ConfidentialNonce(
              ConvertToByteData(txout_item->nonce, txout_item->nonce_len)),
          ConvertToByteData(
              txout_item->surjectionproof, txout_item->surjectionproof_len),
          ConvertToByteData(
              txout_item->rangeproof, txout_item->rangeproof_len));
      vout_work.push_back(txout);
    }

    // If the copy process is successful, release the old buffer
    if (original_address != NULL) {
      wally_tx_free(static_cast<struct wally_tx *>(original_address));
      vin_.clear();
      vout_.clear();
    }
    vin_ = vin_work;
    vout_ = vout_work;
  } catch (const CfdException &exception) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw exception;
  } catch (...) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw CfdException(kCfdUnknownError);
  }
}